

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O2

string * embree::getPlatformName_abi_cxx11_(void)

{
  string *in_RDI;
  allocator local_9;
  
  std::__cxx11::string::string((string *)in_RDI,"Linux (64bit)",&local_9);
  return in_RDI;
}

Assistant:

std::string getPlatformName() 
  {
#if defined(__ANDROID__) && !defined(__64BIT__)
    return "Android (32bit)";
#elif defined(__ANDROID__) && defined(__64BIT__)
    return "Android (64bit)";
#elif defined(__LINUX__) && !defined(__64BIT__)
    return "Linux (32bit)";
#elif defined(__LINUX__) && defined(__64BIT__)
    return "Linux (64bit)";
#elif defined(__FREEBSD__) && !defined(__64BIT__)
    return "FreeBSD (32bit)";
#elif defined(__FREEBSD__) && defined(__64BIT__)
    return "FreeBSD (64bit)";
#elif defined(__CYGWIN__) && !defined(__64BIT__)
    return "Cygwin (32bit)";
#elif defined(__CYGWIN__) && defined(__64BIT__)
    return "Cygwin (64bit)";
#elif defined(__WIN32__) && !defined(__64BIT__)
    return "Windows (32bit)";
#elif defined(__WIN32__) && defined(__64BIT__)
    return "Windows (64bit)";
#elif defined(__MACOSX__) && !defined(__64BIT__)
    return "Mac OS X (32bit)";
#elif defined(__MACOSX__) && defined(__64BIT__)
    return "Mac OS X (64bit)";
#elif defined(__UNIX__) && !defined(__64BIT__)
    return "Unix (32bit)";
#elif defined(__UNIX__) && defined(__64BIT__)
    return "Unix (64bit)";
#else
    return "Unknown";
#endif
  }